

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

bool __thiscall
mprpc::MpRpcServer::notify(MpRpcServer *this,string *conn_id,char *method,void *data,size_t size)

{
  size_t __n;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  msgpack_sbuffer *sbuf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int __flags;
  long *plVar4;
  bool bVar5;
  MsgPackPacker pk;
  unique_lock<std::recursive_mutex> lock;
  MsgPackPacker local_88;
  undefined1 local_60 [16];
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __flags = (int)size;
  local_88.pk.data = &local_88;
  local_88.sb.size = 0;
  local_88.sb.data = (char *)0x0;
  local_88.sb.alloc = 0;
  local_88.pk.callback = msgpack_sbuffer_write;
  pcVar2 = (char *)realloc((void *)0x0,0x2000);
  if (pcVar2 != (char *)0x0) {
    pcVar2[local_88.sb.size] = -0x7d;
    local_88.sb.size = local_88.sb.size + 1;
    local_88.sb.data = pcVar2;
    local_88.sb.alloc = 0x2000;
  }
  local_60[0] = 0xa2;
  (*local_88.pk.callback)(local_88.pk.data,local_60,1);
  (*local_88.pk.callback)(local_88.pk.data,"id",2);
  local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
  (*local_88.pk.callback)(local_88.pk.data,local_60,1);
  MsgPackPacker::pack_map_item(&local_88,"method",method);
  local_60[0] = 0xa6;
  (*local_88.pk.callback)(local_88.pk.data,local_60,1);
  (*local_88.pk.callback)(local_88.pk.data,"params",6);
  (*local_88.pk.callback)(local_88.pk.data,(char *)data,size);
  local_60._0_8_ = this + 8;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
  local_60[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)this_00);
  local_60[8] = true;
  plVar4 = *(long **)(this + 0x40);
  bVar5 = plVar4 == (long *)0x0;
  if (!bVar5) {
    bVar5 = false;
    do {
      __n = conn_id->_M_string_length;
      if (__n == 0) {
        local_40 = plVar4[5];
        local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[6];
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_use_count = local_38->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_use_count = local_38->_M_use_count + 1;
          }
        }
        send((MpRpcServer *)this_00,(int)&local_40,local_88.sb.data,local_88.sb.size,__flags);
        this_00 = local_38;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
      }
      else if (__n == plVar4[2]) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(conn_id->_M_dataplus)._M_p;
        iVar1 = bcmp(this_00,(void *)plVar4[1],__n);
        if (iVar1 == 0) {
          local_50 = plVar4[5];
          local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[6];
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_48->_M_use_count = local_48->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_48->_M_use_count = local_48->_M_use_count + 1;
            }
          }
          uVar3 = send((MpRpcServer *)this_00,(int)&local_50,local_88.sb.data,local_88.sb.size,
                       __flags);
          size = uVar3 & 0xffffffff;
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          break;
        }
      }
      plVar4 = (long *)*plVar4;
      bVar5 = plVar4 == (long *)0x0;
    } while (!bVar5);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_60);
  free(local_88.sb.data);
  return (bool)(bVar5 | (byte)size & 1);
}

Assistant:

bool MpRpcServer::notify(const string& conn_id, const char* method, const void* data, size_t size)
    {
        MsgPackPacker pk;
        pk.pack_map(3);

        pk.pack_map_item("id", 0);
        pk.pack_map_item("method", method);
        pk.pack_string("params");
        msgpack_pack_str_body(&pk.pk, data, size);

        unique_lock<recursive_mutex> lock(m_conn_map_lock);

        for (auto it = m_conn_map.begin(); it != m_conn_map.end(); it++) {
            if (conn_id.empty()) {
                send(it->second, pk.sb.data, pk.sb.size);
            }
            else if (conn_id == it->first) {
                return send(it->second, pk.sb.data, pk.sb.size);
            }
        }
        return true;
    }